

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void * get_from_bucket(ecs_bucket_t *bucket,ecs_map_key_t key,ecs_size_t elem_size)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = (ulong)(uint)bucket->count;
  if (bucket->count < 1) {
    uVar1 = 0;
  }
  iVar2 = 0;
  uVar3 = 0;
  while( true ) {
    if (uVar1 == uVar3) {
      return (void *)0x0;
    }
    if (bucket->keys[uVar3] == key) break;
    uVar3 = uVar3 + 1;
    iVar2 = iVar2 + elem_size;
  }
  return (void *)((long)iVar2 + (long)bucket->payload);
}

Assistant:

static
void* get_from_bucket(
    ecs_bucket_t *bucket,
    ecs_map_key_t key,
    ecs_size_t elem_size)
{
    ecs_map_key_t *keys = bucket->keys;
    int32_t i, count = bucket->count;

    for (i = 0; i < count; i ++) {
        if (keys[i] == key) {
            return GET_ELEM(bucket->payload, elem_size, i);
        }
    }
    return NULL;
}